

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall Utf8Decode_Good_Test::TestBody(Utf8Decode_Good_Test *this)

{
  bytes *input;
  char *message;
  initializer_list<unsigned_char> __l;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_90;
  AssertionResult gtest_ar;
  cpstring local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  local_60._M_dataplus._M_p = (pointer)&DAT_bcce83cf8ccfbace;
  local_60._M_string_length._0_2_ = 0xb5ce;
  __l._M_len = 10;
  __l._M_array = (iterator)&local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&test,__l,(allocator_type *)&local_90);
  (anonymous_namespace)::Utf8Decode::decode_good_abi_cxx11_(&local_60,&test,input);
  local_28 = 0x3ba;
  uStack_24 = 0x3cc;
  uStack_20 = 0x3c3;
  uStack_1c = 0x3bc;
  local_18 = 0x3b5;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_90,&local_28);
  testing::internal::CmpHelperEQ<std::__cxx11::u32string,std::__cxx11::u32string>
            ((internal *)&gtest_ar,"decode_good (std::move (test))",
             "cpstring ({0x03BA, 0x03CC, 0x03C3, 0x03BC, 0x03B5})",&local_60,&local_90);
  std::__cxx11::u32string::~u32string((u32string *)&local_90);
  std::__cxx11::u32string::~u32string((u32string *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x17d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST_F (Utf8Decode, Good) {
    std::vector<std::uint8_t> test{
        0xCE, 0xBA, // GREEK SMALL LETTER KAPPA (U+03BA)
        0xCF, 0x8C, // GREEK SMALL LETTER OMICRON WITH TONOS (U+03CC)
        0xCF, 0x83, // GREEK SMALL LETTER SIGMA (U+03C3)
        0xCE, 0xBC, // GREEK SMALL LETTER MU (U+03BC)
        0xCE, 0xB5, // GREEK SMALL LETTER EPSILON (U+03B5)
    };
    EXPECT_EQ (decode_good (std::move (test)), cpstring ({0x03BA, 0x03CC, 0x03C3, 0x03BC, 0x03B5}));
}